

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringtokenizer.h
# Opt level: O2

next_result * __thiscall
QStringTokenizerBase<QLatin1String,_QChar>::next
          (next_result *__return_storage_ptr__,QStringTokenizerBase<QLatin1String,_QChar> *this,
          tokenizer_state state)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  lVar2 = state.start;
  do {
    state.start = lVar2;
    if (state.end < 0) {
      (__return_storage_ptr__->value).m_size = 0;
      (__return_storage_ptr__->value).m_data = (char *)0x0;
      __return_storage_ptr__->ok = false;
      goto LAB_0010d8c4;
    }
    state.end = QLatin1String::indexOf
                          (&this->m_haystack,(QChar)(char16_t)*(undefined4 *)&this->m_needle,
                           state.extra + state.start,(this->super_QStringTokenizerBaseBase).m_cs);
    if (state.end < 0) {
      lVar2 = state.start;
      lVar3 = (this->m_haystack).m_size;
    }
    else {
      lVar2 = state.end + 1;
      state.extra = 0;
      lVar3 = state.end;
    }
  } while ((((this->super_QStringTokenizerBaseBase).m_sb.
             super_QFlagsStorageHelper<Qt::SplitBehaviorFlags,_4>.
             super_QFlagsStorage<Qt::SplitBehaviorFlags>.i & 1) != 0) && (lVar3 == state.start));
  pcVar1 = (this->m_haystack).m_data;
  (__return_storage_ptr__->value).m_size = lVar3 - state.start;
  (__return_storage_ptr__->value).m_data = pcVar1 + state.start;
  __return_storage_ptr__->ok = true;
  state.start = lVar2;
LAB_0010d8c4:
  (__return_storage_ptr__->state).extra = state.extra;
  (__return_storage_ptr__->state).start = state.start;
  (__return_storage_ptr__->state).end = state.end;
  return __return_storage_ptr__;
}

Assistant:

auto QStringTokenizerBase<Haystack, Needle>::next(tokenizer_state state) const noexcept -> next_result
{
    while (true) {
        if (state.end < 0) {
            // already at end:
            return {{}, false, state};
        }
        state.end = m_haystack.indexOf(m_needle, state.start + state.extra, m_cs);
        Haystack result;
        if (state.end >= 0) {
            // token separator found => return intermediate element:
            result = m_haystack.sliced(state.start, state.end - state.start);
            const auto ns = QtPrivate::Tok::tokenSize(m_needle);
            state.start = state.end + ns;
            state.extra = (ns == 0 ? 1 : 0);
        } else {
            // token separator not found => return final element:
            result = m_haystack.sliced(state.start);
        }
        if ((m_sb & Qt::SkipEmptyParts) && result.isEmpty())
            continue;
        return {result, true, state};
    }
}